

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O3

IMAGE_IMPORT_BY_NAME * __thiscall ImportedFuncWrapper::getImportByNamePtr(ImportedFuncWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IMAGE_IMPORT_BY_NAME *pIVar4;
  bool isOk;
  undefined8 uStack_18;
  long lVar3;
  undefined4 extraout_var_01;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  iVar2 = (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,0,0xffffffffffffffff,(long)&uStack_18 + 7);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if ((lVar3 != -1 & uStack_18._7_1_) == 0) {
    iVar2 = (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                      (this,1,0xffffffffffffffff,(long)&uStack_18 + 7);
    lVar3 = CONCAT44(extraout_var_00,iVar2);
  }
  if ((uStack_18._7_1_ & 1) == 0) {
    pIVar4 = (IMAGE_IMPORT_BY_NAME *)0x0;
  }
  else {
    pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,lVar3,2,4,0);
    pIVar4 = (IMAGE_IMPORT_BY_NAME *)CONCAT44(extraout_var_01,iVar2);
  }
  return pIVar4;
}

Assistant:

IMAGE_IMPORT_BY_NAME* ImportedFuncWrapper::getImportByNamePtr()
{
    bool isOk = false;
    uint64_t offset = this->getNumValue(ImportedFuncWrapper::ORIG_THUNK, &isOk);
    if (!isOk || offset == INVALID_ADDR) {
        offset = this->getNumValue(ImportedFuncWrapper::THUNK, &isOk);
    }
    if (!isOk) return NULL;
    BYTE *ptr = this->m_Exe->getContentAt(offset, Executable::RVA, sizeof(IMAGE_IMPORT_BY_NAME));
    return (IMAGE_IMPORT_BY_NAME*) ptr;
}